

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_uint.h
# Opt level: O2

void vec_uint_push_back(vec_uint_t *p,uint value)

{
  uint uVar1;
  uint new_cap;
  
  uVar1 = p->size;
  if (uVar1 == p->cap) {
    new_cap = 0x10;
    if (0xf < uVar1) {
      new_cap = uVar1 * 2;
    }
    vec_uint_reserve(p,new_cap);
  }
  p->data[p->size] = value;
  p->size = p->size + 1;
  return;
}

Assistant:

static inline void vec_uint_push_back(vec_uint_t *p, unsigned value)
{
    if (p->size == p->cap) {
        if (p->cap < 16)
            vec_uint_reserve(p, 16);
        else
            vec_uint_reserve(p, 2 * p->cap);
    }
    p->data[p->size] = value;
    p->size++;
}